

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_color.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long *plVar1;
  char cVar2;
  ALLEGRO_DISPLAY *display;
  ALLEGRO_FONT *font;
  long *plVar3;
  undefined8 extraout_RAX;
  char *format;
  long lVar4;
  Theme theme;
  Prog prog;
  code *apcStack_1420 [2];
  Theme local_1410;
  Prog local_13d8;
  
  apcStack_1420[0] = (code *)0x107501;
  cVar2 = al_install_system(0x5020700,atexit);
  if (cVar2 == '\0') {
    format = "Could not init Allegro\n";
  }
  else {
    apcStack_1420[0] = (code *)0x10750e;
    al_init_primitives_addon();
    apcStack_1420[0] = (code *)0x107513;
    al_install_keyboard();
    apcStack_1420[0] = (code *)0x107518;
    al_install_mouse();
    apcStack_1420[0] = (code *)0x10751d;
    al_init_font_addon();
    apcStack_1420[0] = (code *)0x107522;
    al_init_ttf_addon();
    apcStack_1420[0] = (code *)0x10752c;
    al_set_new_display_flags(0x40);
    apcStack_1420[0] = (code *)0x10753b;
    display = (ALLEGRO_DISPLAY *)al_create_display(0x2d0,0x1e0);
    if (display == (ALLEGRO_DISPLAY *)0x0) {
      format = "Unable to create display\n";
    }
    else {
      apcStack_1420[0] = (code *)0x10755a;
      font = (ALLEGRO_FONT *)al_load_font("data/DejaVuSans.ttf",0xc,0);
      if (font != (ALLEGRO_FONT *)0x0) {
        apcStack_1420[0] = (code *)0x107576;
        Theme::Theme(&local_1410,font);
        apcStack_1420[0] = (code *)0x107589;
        Prog::Prog(&local_13d8,&local_1410,display);
        apcStack_1420[0] = (code *)0x107591;
        Prog::run(&local_13d8);
        lVar4 = 0x1350;
        do {
          plVar3 = (long *)((long)&local_13d8.d.theme + lVar4);
          *(undefined ***)((long)apcStack_1420 + lVar4) = &PTR__Label_0010d7a0;
          plVar1 = *(long **)((long)&local_1410.highlight.b + lVar4);
          if (plVar3 != plVar1) {
            apcStack_1420[0] = (code *)0x1075c2;
            operator_delete(plVar1,*plVar3 + 1);
          }
          lVar4 = lVar4 + -0x60;
        } while (lVar4 != 0xc30);
        lVar4 = 0xc30;
        do {
          plVar3 = (long *)((long)&local_13d8.d.theme + lVar4);
          *(undefined ***)((long)apcStack_1420 + lVar4) = &PTR__Label_0010d7a0;
          plVar1 = *(long **)((long)&local_1410.highlight.b + lVar4);
          if (plVar3 != plVar1) {
            apcStack_1420[0] = (code *)0x1075f5;
            operator_delete(plVar1,*plVar3 + 1);
          }
          lVar4 = lVar4 + -0x60;
        } while (lVar4 != 0x510);
        apcStack_1420[0] = (code *)0x10760c;
        Dialog::~Dialog(&local_13d8.d);
        apcStack_1420[0] = (code *)0x107614;
        al_destroy_font(font);
        return 0;
      }
      format = "Failed to load data/DejaVuSans.ttf\n";
    }
  }
  apcStack_1420[0] = (code *)0x107645;
  abort_example(format);
  apcStack_1420[0] = (code *)0x107652;
  Prog::~Prog(&local_13d8);
  apcStack_1420[0] = std::__cxx11::string::string<std::allocator<char>>;
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char *argv[])
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_FONT *font;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro\n");
   }
   al_init_primitives_addon();
   al_install_keyboard();
   al_install_mouse();

   al_init_font_addon();
   al_init_ttf_addon();
   init_platform_specific();

   al_set_new_display_flags(ALLEGRO_GENERATE_EXPOSE_EVENTS);
   display = al_create_display(720, 480);
   if (!display) {
      abort_example("Unable to create display\n");
   }
   font = al_load_font("data/DejaVuSans.ttf", 12, 0);
   if (!font) {
      abort_example("Failed to load data/DejaVuSans.ttf\n");
   }

   /* Prog is destroyed at the end of this scope. */
   {
      Theme theme(font);
      Prog prog(theme, display);
      prog.run();
   }

   al_destroy_font(font);

   return 0;
}